

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

char * print_string_ptr(char *str,printbuffer *p)

{
  int iVar1;
  bool bVar2;
  byte bVar3;
  void *pvVar4;
  byte *pbVar5;
  int iVar6;
  byte *pbVar7;
  int iVar8;
  char *pcVar9;
  
  if (str == (char *)0x0) {
    if (p == (printbuffer *)0x0) {
      pcVar9 = (char *)(*cJSON_malloc)(3);
    }
    else {
      pcVar9 = ensure(p,3);
    }
    if (pcVar9 != (char *)0x0) {
      pcVar9[2] = '\0';
      pcVar9[0] = '\"';
      pcVar9[1] = '\"';
      return pcVar9;
    }
  }
  else {
    bVar3 = *str;
    pcVar9 = str;
    if (bVar3 == 0) {
      bVar2 = true;
    }
    else {
      bVar2 = false;
      do {
        bVar2 = (bool)(bVar2 | ((bVar3 == 0x5c || bVar3 == 0x22) || bVar3 < 0x20));
        bVar3 = pcVar9[1];
        pcVar9 = pcVar9 + 1;
      } while (bVar3 != 0);
      bVar2 = !bVar2;
    }
    if (bVar2) {
      iVar8 = (int)pcVar9 - (int)str;
      if (p == (printbuffer *)0x0) {
        pcVar9 = (char *)(*cJSON_malloc)((long)(iVar8 + 3));
      }
      else {
        pcVar9 = ensure(p,iVar8 + 3);
      }
      if (pcVar9 != (char *)0x0) {
        *pcVar9 = '\"';
        strcpy(pcVar9 + 1,str);
        pcVar9[(long)iVar8 + 1] = '\"';
        pcVar9[(long)(iVar8 + 1) + 1] = '\0';
        return pcVar9;
      }
    }
    else {
      bVar3 = *str;
      if (bVar3 == 0) {
        iVar8 = 3;
      }
      else {
        pbVar7 = (byte *)(str + 1);
        iVar8 = 0;
        do {
          if (iVar8 + 1 == 0) {
            iVar8 = 0;
            break;
          }
          pvVar4 = memchr("\"\\\b\f\n\r\t",(uint)bVar3,8);
          iVar1 = iVar8 + 2;
          iVar6 = iVar8 + 1;
          if (bVar3 < 0x20) {
            iVar6 = iVar8 + 6;
          }
          iVar8 = iVar6;
          if (pvVar4 != (void *)0x0) {
            iVar8 = iVar1;
          }
          bVar3 = *pbVar7;
          pbVar7 = pbVar7 + 1;
        } while (bVar3 != 0);
        iVar8 = iVar8 + 3;
      }
      if (p == (printbuffer *)0x0) {
        pcVar9 = (char *)(*cJSON_malloc)((long)iVar8);
      }
      else {
        pcVar9 = ensure(p,iVar8);
      }
      if (pcVar9 != (char *)0x0) {
        pbVar7 = (byte *)(pcVar9 + 1);
        *pcVar9 = '\"';
        bVar3 = *str;
        if (bVar3 != 0) {
          pbVar5 = (byte *)(str + 1);
          do {
            if (((bVar3 < 0x20) || (bVar3 == 0x22)) || (bVar3 == 0x5c)) {
              *pbVar7 = 0x5c;
              bVar3 = pbVar5[-1];
              switch(bVar3) {
              case 8:
                pbVar7[1] = 0x62;
                break;
              case 9:
                pbVar7[1] = 0x74;
                break;
              case 10:
                pbVar7[1] = 0x6e;
                break;
              case 0xb:
switchD_001092e3_caseD_b:
                sprintf((char *)(pbVar7 + 1),"u%04x");
                pbVar7 = pbVar7 + 6;
                goto LAB_00109347;
              case 0xc:
                pbVar7[1] = 0x66;
                break;
              case 0xd:
                pbVar7[1] = 0x72;
                break;
              default:
                if (bVar3 == 0x22) {
                  pbVar7[1] = 0x22;
                }
                else {
                  if (bVar3 != 0x5c) goto switchD_001092e3_caseD_b;
                  pbVar7[1] = 0x5c;
                }
              }
              pbVar7 = pbVar7 + 2;
            }
            else {
              *pbVar7 = bVar3;
              pbVar7 = pbVar7 + 1;
            }
LAB_00109347:
            bVar3 = *pbVar5;
            pbVar5 = pbVar5 + 1;
          } while (bVar3 != 0);
        }
        pbVar7[0] = 0x22;
        pbVar7[1] = 0;
        return pcVar9;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

static char *print_string_ptr(const char *str,printbuffer *p)
{
	const char *ptr;char *ptr2,*out;int len=0,flag=0;unsigned char token;

	if (!str)
	{
		if (p)	out=ensure(p,3);
		else	out=(char*)cJSON_malloc(3);
		if (!out) return 0;
		strcpy(out,"\"\"");
		return out;
	}
	
	for (ptr=str;*ptr;ptr++) flag|=((*ptr>0 && *ptr<32)||(*ptr=='\"')||(*ptr=='\\'))?1:0;
	if (!flag)
	{
		len=(int)(ptr-str);
		if (p) out=ensure(p,len+3);
		else		out=(char*)cJSON_malloc(len+3);
		if (!out) return 0;
		ptr2=out;*ptr2++='\"';
		strcpy(ptr2,str);
		ptr2[len]='\"';
		ptr2[len+1]=0;
		return out;
	}
	
	ptr=str;while ((token=*ptr) && ++len) {if (strchr("\"\\\b\f\n\r\t",token)) len++; else if (token<32) len+=5;ptr++;}
	
	if (p)	out=ensure(p,len+3);
	else	out=(char*)cJSON_malloc(len+3);
	if (!out) return 0;

	ptr2=out;ptr=str;
	*ptr2++='\"';
	while (*ptr)
	{
		if ((unsigned char)*ptr>31 && *ptr!='\"' && *ptr!='\\') *ptr2++=*ptr++;
		else
		{
			*ptr2++='\\';
			switch (token=*ptr++)
			{
				case '\\':	*ptr2++='\\';	break;
				case '\"':	*ptr2++='\"';	break;
				case '\b':	*ptr2++='b';	break;
				case '\f':	*ptr2++='f';	break;
				case '\n':	*ptr2++='n';	break;
				case '\r':	*ptr2++='r';	break;
				case '\t':	*ptr2++='t';	break;
				default: sprintf(ptr2,"u%04x",token);ptr2+=5;	break;	/* escape and print */
			}
		}
	}
	*ptr2++='\"';*ptr2++=0;
	return out;
}